

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

SceneLight * __thiscall
CS248::Application::initLight(Application *this,LightInfo *light,Matrix4x4 *transform)

{
  float fVar1;
  AreaLight *this_00;
  
  switch(light->light_type) {
  case AMBIENT:
    this_00 = (AreaLight *)operator_new(0x18);
    (this_00->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_getStaticLight_002492d8;
    fVar1 = (light->spectrum).g;
    (this_00->spectrum).r = (light->spectrum).r;
    (this_00->spectrum).g = fVar1;
    (this_00->spectrum).b = (light->spectrum).b;
    break;
  case DIRECTIONAL:
    this_00 = (AreaLight *)operator_new(0x30);
    DynamicScene::DirectionalLight::DirectionalLight((DirectionalLight *)this_00,light,transform);
    break;
  case AREA:
    this_00 = (AreaLight *)operator_new(0x78);
    DynamicScene::AreaLight::AreaLight(this_00,light,transform);
    break;
  case POINT:
    this_00 = (AreaLight *)operator_new(0x30);
    DynamicScene::PointLight::PointLight((PointLight *)this_00,light,transform);
    break;
  case SPOT:
    this_00 = (AreaLight *)operator_new(0x50);
    DynamicScene::SpotLight::SpotLight((SpotLight *)this_00,light,transform);
    break;
  default:
    this_00 = (AreaLight *)0x0;
  }
  return &this_00->super_SceneLight;
}

Assistant:

DynamicScene::SceneLight* Application::initLight(LightInfo& light, const Matrix4x4& transform) {
    switch (light.light_type) {
      case Collada::LightType::NONE:
        break;
      case Collada::LightType::AMBIENT:
        return new DynamicScene::AmbientLight(light);
      case Collada::LightType::DIRECTIONAL:
        return new DynamicScene::DirectionalLight(light, transform);
      case Collada::LightType::AREA:
        return new DynamicScene::AreaLight(light, transform);
      case Collada::LightType::POINT:
        return new DynamicScene::PointLight(light, transform);
      case Collada::LightType::SPOT:
        return new DynamicScene::SpotLight(light, transform);
      default:
        break;
    }

    return nullptr;
}